

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

Aig_Man_t * Saig_Synchronize(Aig_Man_t *pAig1,Aig_Man_t *pAig2,int nWords,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Str_t *p;
  abctime aVar4;
  Vec_Str_t *p_00;
  Vec_Ptr_t *vSimInfo_00;
  Aig_Man_t *p0;
  Aig_Man_t *p1;
  abctime clk;
  int RetValue;
  Vec_Ptr_t *vSimInfo;
  Vec_Str_t *vSeq2;
  Vec_Str_t *vSeq1;
  Aig_Man_t *pMiter;
  Aig_Man_t *pAig2z;
  Aig_Man_t *pAig1z;
  int fVerbose_local;
  int nWords_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  if (fVerbose != 0) {
    printf("Design 1: ");
    Aig_ManPrintStats(pAig1);
    printf("Design 2: ");
    Aig_ManPrintStats(pAig2);
  }
  aVar3 = Abc_Clock();
  p = Saig_SynchSequence(pAig1,nWords);
  if (p == (Vec_Str_t *)0x0) {
    printf("Design 1: Synchronizing sequence is not found. ");
  }
  else if (fVerbose != 0) {
    iVar1 = Vec_StrSize(p);
    iVar2 = Saig_ManPiNum(pAig1);
    printf("Design 1: Synchronizing sequence of length %4d is found. ",
           (long)iVar1 / (long)iVar2 & 0xffffffff,(long)iVar1 % (long)iVar2 & 0xffffffff);
  }
  if (fVerbose == 0) {
    printf("\n");
  }
  else {
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  aVar3 = Abc_Clock();
  p_00 = Saig_SynchSequence(pAig2,nWords);
  if (p_00 == (Vec_Str_t *)0x0) {
    printf("Design 2: Synchronizing sequence is not found. ");
  }
  else if (fVerbose != 0) {
    iVar1 = Vec_StrSize(p_00);
    iVar2 = Saig_ManPiNum(pAig2);
    printf("Design 2: Synchronizing sequence of length %4d is found. ",
           (long)iVar1 / (long)iVar2 & 0xffffffff,(long)iVar1 % (long)iVar2 & 0xffffffff);
  }
  if (fVerbose == 0) {
    printf("\n");
  }
  else {
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  if ((p == (Vec_Str_t *)0x0) || (p_00 == (Vec_Str_t *)0x0)) {
    printf("Quitting synchronization.\n");
    if (p != (Vec_Str_t *)0x0) {
      Vec_StrFree(p);
    }
    if (p_00 != (Vec_Str_t *)0x0) {
      Vec_StrFree(p_00);
    }
    pAig1_local = (Aig_Man_t *)0x0;
  }
  else {
    aVar3 = Abc_Clock();
    iVar1 = Aig_ManObjNumMax(pAig1);
    iVar2 = Aig_ManObjNumMax(pAig2);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    vSimInfo_00 = Vec_PtrAllocSimInfo(iVar1,1);
    iVar1 = Saig_SynchSequenceRun(pAig1,vSimInfo_00,p,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x274,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Saig_SynchSequenceRun(pAig1,vSimInfo_00,p_00,0);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x276,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Saig_SynchSequenceRun(pAig2,vSimInfo_00,p_00,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x27a,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    p0 = Saig_ManDupInitZero(pAig1);
    p1 = Saig_ManDupInitZero(pAig2);
    pAig1_local = Saig_ManCreateMiter(p0,p1,0);
    Aig_ManCleanup(pAig1_local);
    Aig_ManStop(p0);
    Aig_ManStop(p1);
    Vec_PtrFree(vSimInfo_00);
    Vec_StrFree(p);
    Vec_StrFree(p_00);
    Aig_ManCleanMarkA(pAig1);
    Aig_ManCleanMarkA(pAig2);
    if (fVerbose != 0) {
      printf("Miter of the synchronized designs is constructed.         ");
      Abc_Print(1,"%s =","Time");
      aVar4 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
    }
  }
  return pAig1_local;
}

Assistant:

Aig_Man_t * Saig_Synchronize( Aig_Man_t * pAig1, Aig_Man_t * pAig2, int nWords, int fVerbose )
{
    Aig_Man_t * pAig1z, * pAig2z, * pMiter;
    Vec_Str_t * vSeq1, * vSeq2;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;
/*
    {
        unsigned u = Saig_SynchRandomTernary();
        unsigned w = Saig_SynchRandomTernary();
        unsigned x = Saig_SynchNot( u );
        unsigned y = Saig_SynchNot( w );
        unsigned z = Saig_SynchAnd( x, y );

        Extra_PrintBinary( stdout, &u, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &w, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &x, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &y, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &z, 32 );  printf( "\n" );
    }
*/
    // report statistics
    if ( fVerbose )
    {
        printf( "Design 1: " );
        Aig_ManPrintStats( pAig1 );
        printf( "Design 2: " );
        Aig_ManPrintStats( pAig2 );
    }

    // synchronize the first design
    clk = Abc_Clock();
    vSeq1 = Saig_SynchSequence( pAig1, nWords );
    if ( vSeq1 == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq1) / Saig_ManPiNum(pAig1) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // synchronize the first design
    clk = Abc_Clock();
    vSeq2 = Saig_SynchSequence( pAig2, nWords );
    if ( vSeq2 == NULL )
        printf( "Design 2: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 2: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq2) / Saig_ManPiNum(pAig2) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // quit if one of the designs cannot be synchronized
    if ( vSeq1 == NULL || vSeq2 == NULL )
    {
        printf( "Quitting synchronization.\n" );
        if ( vSeq1 ) Vec_StrFree( vSeq1 );
        if ( vSeq2 ) Vec_StrFree( vSeq2 );
        return NULL;
    }
    clk = Abc_Clock();
    vSimInfo = Vec_PtrAllocSimInfo( Abc_MaxInt( Aig_ManObjNumMax(pAig1), Aig_ManObjNumMax(pAig2) ), 1 );

    // process Design 1
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq1, 1 );
    assert( RetValue == 0 );
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq2, 0 );
    assert( RetValue == 0 );

    // process Design 2
    RetValue = Saig_SynchSequenceRun( pAig2, vSimInfo, vSeq2, 1 );
    assert( RetValue == 0 );

    // duplicate designs
    pAig1z = Saig_ManDupInitZero( pAig1 );
    pAig2z = Saig_ManDupInitZero( pAig2 );
    pMiter = Saig_ManCreateMiter( pAig1z, pAig2z, 0 );
    Aig_ManCleanup( pMiter );
    Aig_ManStop( pAig1z );
    Aig_ManStop( pAig2z );

    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSeq1 );
    Vec_StrFree( vSeq2 );
    Aig_ManCleanMarkA( pAig1 );
    Aig_ManCleanMarkA( pAig2 );

    if ( fVerbose )
    {
        printf( "Miter of the synchronized designs is constructed.         " );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return pMiter;
}